

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

void fs_event_cb_close(uv_fs_event_t *handle,char *filename,int events,int status)

{
  undefined8 uVar1;
  undefined4 in_register_00000014;
  char *pcVar2;
  
  if (status == 0) {
    if (fs_event_cb_called < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        uv_close(handle,close_cb,CONCAT44(in_register_00000014,events));
        return;
      }
      return;
    }
    pcVar2 = "fs_event_cb_called < 3";
    uVar1 = 0x19f;
  }
  else {
    pcVar2 = "status == 0";
    uVar1 = 0x19d;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
          ,uVar1,pcVar2);
  abort();
}

Assistant:

static void fs_event_cb_close(uv_fs_event_t* handle,
                              const char* filename,
                              int events,
                              int status) {
  ASSERT(status == 0);

  ASSERT(fs_event_cb_called < 3);
  ++fs_event_cb_called;

  if (fs_event_cb_called == 3) {
    uv_close((uv_handle_t*) handle, close_cb);
  }
}